

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjIterLookupTable::get_cur_entry(CVmObjIterLookupTable *this,vm_val_t *valp,vm_val_t *keyp)

{
  uint uVar1;
  uint uVar2;
  CVmObject *this_00;
  long lVar3;
  vm_lookup_ext *this_01;
  vm_lookup_val *pvVar4;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  vm_lookup_val *entryp;
  CVmObjLookupTable *ltab;
  vm_val_t coll;
  uint entry;
  vm_val_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar5;
  
  get_coll_val((CVmObjIterLookupTable *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
  this_00 = vm_objp(0);
  lVar3 = get_entry_index((CVmObjIterLookupTable *)0x36b54f);
  uVar1 = (uint)lVar3;
  if (uVar1 != 0) {
    uVar5 = uVar1;
    uVar2 = CVmObjLookupTable::get_entry_count((CVmObjLookupTable *)0x36b56c);
    if (uVar5 <= uVar2) {
      this_01 = CVmObjLookupTable::get_ext((CVmObjLookupTable *)this_00);
      pvVar4 = vm_lookup_ext::idx_to_val(this_01,uVar1 - 1);
      if ((pvVar4->key).typ == VM_EMPTY) {
        err_throw(0);
      }
      if (in_RSI != (undefined8 *)0x0) {
        *in_RSI = *(undefined8 *)&pvVar4->val;
        *(anon_union_8_8_cb74652f_for_val *)(in_RSI + 1) = (pvVar4->val).val;
      }
      if (in_RDX != (undefined8 *)0x0) {
        *in_RDX = *(undefined8 *)&pvVar4->key;
        *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 1) = (pvVar4->key).val;
      }
      return;
    }
  }
  err_throw(0);
}

Assistant:

void CVmObjIterLookupTable::get_cur_entry(VMG_ vm_val_t *valp,
                                          vm_val_t *keyp) const
{
    uint entry;
    vm_val_t coll;
    CVmObjLookupTable *ltab;
    vm_lookup_val *entryp;

    /* get my collection object */
    get_coll_val(&coll);
    ltab = (CVmObjLookupTable *)vm_objp(vmg_ coll.val.obj);

    /* make sure the index is in range */
    entry = get_entry_index();
    if (entry < 1 || entry > ltab->get_entry_count())
        err_throw(VMERR_OUT_OF_RANGE);

    /* translate our 1-based index to an entry pointer */
    entryp = ltab->get_ext()->idx_to_val(entry - 1);

    /* if the current entry has been deleted, we have no valid current item */
    if (entryp->key.typ == VM_EMPTY)
        err_throw(VMERR_OUT_OF_RANGE);

    /* retrieve this entry's value and key for the caller, as desired */
    if (valp != 0)
        *valp = entryp->val;
    if (keyp != 0)
        *keyp = entryp->key;
}